

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_metadata.cpp
# Opt level: O0

Value * duckdb::ParquetLogicalTypeToString(LogicalType *type,bool is_set)

{
  byte in_DL;
  long in_RSI;
  Value *in_RDI;
  LogicalType local_218 [24];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [24];
  TimeType *in_stack_fffffffffffffef8;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [48];
  LogicalType local_30 [31];
  byte local_11;
  
  local_11 = in_DL & 1;
  if (local_11 == 0) {
    duckdb::LogicalType::LogicalType(local_30,SQLNULL);
    duckdb::Value::Value(in_RDI,local_30);
    duckdb::LogicalType::~LogicalType(local_30);
  }
  else if ((*(ushort *)(in_RSI + 0xe8) & 1) == 0) {
    if ((*(ushort *)(in_RSI + 0xe8) >> 1 & 1) == 0) {
      if ((*(ushort *)(in_RSI + 0xe8) >> 2 & 1) == 0) {
        if ((*(ushort *)(in_RSI + 0xe8) >> 3 & 1) == 0) {
          if ((*(ushort *)(in_RSI + 0xe8) >> 4 & 1) == 0) {
            if ((*(ushort *)(in_RSI + 0xe8) >> 5 & 1) == 0) {
              if ((*(ushort *)(in_RSI + 0xe8) >> 6 & 1) == 0) {
                if ((*(ushort *)(in_RSI + 0xe8) >> 7 & 1) == 0) {
                  if ((*(ushort *)(in_RSI + 0xe8) >> 8 & 1) == 0) {
                    if ((*(ushort *)(in_RSI + 0xe8) >> 9 & 1) == 0) {
                      if ((*(ushort *)(in_RSI + 0xe8) >> 10 & 1) == 0) {
                        if ((*(ushort *)(in_RSI + 0xe8) >> 0xb & 1) == 0) {
                          if ((*(ushort *)(in_RSI + 0xe8) >> 0xc & 1) == 0) {
                            if ((*(ushort *)(in_RSI + 0xe8) >> 0xd & 1) == 0) {
                              duckdb::LogicalType::LogicalType(local_218,SQLNULL);
                              duckdb::Value::Value(in_RDI,local_218);
                              duckdb::LogicalType::~LogicalType(local_218);
                            }
                            else {
                              PrintParquetElementToString<duckdb_parquet::Float16Type_const&>
                                        ((Float16Type *)in_stack_fffffffffffffef8);
                              duckdb::Value::Value(in_RDI,local_200);
                              std::__cxx11::string::~string(local_200);
                            }
                          }
                          else {
                            PrintParquetElementToString<duckdb_parquet::UUIDType_const&>
                                      ((UUIDType *)in_stack_fffffffffffffef8);
                            duckdb::Value::Value(in_RDI,local_1e0);
                            std::__cxx11::string::~string(local_1e0);
                          }
                        }
                        else {
                          PrintParquetElementToString<duckdb_parquet::BsonType_const&>
                                    ((BsonType *)in_stack_fffffffffffffef8);
                          duckdb::Value::Value(in_RDI,local_1c0);
                          std::__cxx11::string::~string(local_1c0);
                        }
                      }
                      else {
                        PrintParquetElementToString<duckdb_parquet::JsonType_const&>
                                  ((JsonType *)in_stack_fffffffffffffef8);
                        duckdb::Value::Value(in_RDI,local_1a0);
                        std::__cxx11::string::~string(local_1a0);
                      }
                    }
                    else {
                      PrintParquetElementToString<duckdb_parquet::NullType_const&>
                                ((NullType *)in_stack_fffffffffffffef8);
                      duckdb::Value::Value(in_RDI,local_180);
                      std::__cxx11::string::~string(local_180);
                    }
                  }
                  else {
                    PrintParquetElementToString<duckdb_parquet::IntType_const&>
                              ((IntType *)in_stack_fffffffffffffef8);
                    duckdb::Value::Value(in_RDI,local_160);
                    std::__cxx11::string::~string(local_160);
                  }
                }
                else {
                  PrintParquetElementToString<duckdb_parquet::TimestampType_const&>
                            ((TimestampType *)in_stack_fffffffffffffef8);
                  duckdb::Value::Value(in_RDI,local_140);
                  std::__cxx11::string::~string(local_140);
                }
              }
              else {
                PrintParquetElementToString<duckdb_parquet::TimeType_const&>
                          (in_stack_fffffffffffffef8);
                duckdb::Value::Value(in_RDI,local_120);
                std::__cxx11::string::~string(local_120);
              }
            }
            else {
              PrintParquetElementToString<duckdb_parquet::DateType_const&>
                        ((DateType *)in_stack_fffffffffffffef8);
              duckdb::Value::Value(in_RDI,local_100);
              std::__cxx11::string::~string(local_100);
            }
          }
          else {
            PrintParquetElementToString<duckdb_parquet::DecimalType_const&>
                      ((DecimalType *)in_stack_fffffffffffffef8);
            duckdb::Value::Value(in_RDI,local_e0);
            std::__cxx11::string::~string(local_e0);
          }
        }
        else {
          PrintParquetElementToString<duckdb_parquet::EnumType_const&>
                    ((EnumType *)in_stack_fffffffffffffef8);
          duckdb::Value::Value(in_RDI,local_c0);
          std::__cxx11::string::~string(local_c0);
        }
      }
      else {
        PrintParquetElementToString<duckdb_parquet::ListType_const&>
                  ((ListType *)in_stack_fffffffffffffef8);
        duckdb::Value::Value(in_RDI,local_a0);
        std::__cxx11::string::~string(local_a0);
      }
    }
    else {
      PrintParquetElementToString<duckdb_parquet::MapType_const&>
                ((MapType *)in_stack_fffffffffffffef8);
      duckdb::Value::Value(in_RDI,local_80);
      std::__cxx11::string::~string(local_80);
    }
  }
  else {
    PrintParquetElementToString<duckdb_parquet::StringType_const&>
              ((StringType *)in_stack_fffffffffffffef8);
    duckdb::Value::Value(in_RDI,local_60);
    std::__cxx11::string::~string(local_60);
  }
  return in_RDI;
}

Assistant:

Value ParquetLogicalTypeToString(const duckdb_parquet::LogicalType &type, bool is_set) {
	if (!is_set) {
		return Value();
	}
	if (type.__isset.STRING) {
		return Value(PrintParquetElementToString(type.STRING));
	}
	if (type.__isset.MAP) {
		return Value(PrintParquetElementToString(type.MAP));
	}
	if (type.__isset.LIST) {
		return Value(PrintParquetElementToString(type.LIST));
	}
	if (type.__isset.ENUM) {
		return Value(PrintParquetElementToString(type.ENUM));
	}
	if (type.__isset.DECIMAL) {
		return Value(PrintParquetElementToString(type.DECIMAL));
	}
	if (type.__isset.DATE) {
		return Value(PrintParquetElementToString(type.DATE));
	}
	if (type.__isset.TIME) {
		return Value(PrintParquetElementToString(type.TIME));
	}
	if (type.__isset.TIMESTAMP) {
		return Value(PrintParquetElementToString(type.TIMESTAMP));
	}
	if (type.__isset.INTEGER) {
		return Value(PrintParquetElementToString(type.INTEGER));
	}
	if (type.__isset.UNKNOWN) {
		return Value(PrintParquetElementToString(type.UNKNOWN));
	}
	if (type.__isset.JSON) {
		return Value(PrintParquetElementToString(type.JSON));
	}
	if (type.__isset.BSON) {
		return Value(PrintParquetElementToString(type.BSON));
	}
	if (type.__isset.UUID) {
		return Value(PrintParquetElementToString(type.UUID));
	}
	if (type.__isset.FLOAT16) {
		return Value(PrintParquetElementToString(type.FLOAT16));
	}
	return Value();
}